

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall flow::lang::WhileStmt::~WhileStmt(WhileStmt *this)

{
  WhileStmt *this_local;
  
  ~WhileStmt(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

WhileStmt(SourceLocation loc, std::unique_ptr<Expr> cond, std::unique_ptr<Stmt> bodyStmt)
      : Stmt{std::move(loc)},
        cond_{std::move(cond)},
        bodyStmt_{std::move(bodyStmt)} {}